

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O2

self_type * __thiscall
boost::function<void_(const_boost::debug::dbg_startup_info_&)>::operator=
          (function<void_(const_boost::debug::dbg_startup_info_&)> *this,self_type *f)

{
  function1<void,_const_boost::debug::dbg_startup_info_&> local_30;
  
  function1<void,_const_boost::debug::dbg_startup_info_&>::function1
            (&local_30,&f->super_function1<void,_const_boost::debug::dbg_startup_info_&>);
  function1<void,_const_boost::debug::dbg_startup_info_&>::swap
            (&local_30,&this->super_function1<void,_const_boost::debug::dbg_startup_info_&>);
  function1<void,_const_boost::debug::dbg_startup_info_&>::~function1(&local_30);
  return this;
}

Assistant:

self_type& operator=(const self_type& f)
  {
    self_type(f).swap(*this);
    return *this;
  }